

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O2

void __thiscall
tf::UnboundedTaskQueue<tf::Node_*>::UnboundedTaskQueue
          (UnboundedTaskQueue<tf::Node_*> *this,int64_t LogSize)

{
  Array *this_00;
  
  (this->_garbage).
  super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_garbage).
  super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_garbage).
  super__Vector_base<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_top).super___atomic_base<long>._M_i = 0;
  (this->_bottom).super___atomic_base<long>._M_i = 0;
  this_00 = (Array *)operator_new(0x18);
  Array::Array(this_00,1L << ((byte)LogSize & 0x3f));
  (this->_array)._M_b._M_p = this_00;
  std::
  vector<tf::UnboundedTaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::UnboundedTaskQueue<tf::Node_*>::Array_*>_>
  ::reserve(&this->_garbage,0x20);
  return;
}

Assistant:

UnboundedTaskQueue<T>::UnboundedTaskQueue(int64_t LogSize) {
  _top.store(0, std::memory_order_relaxed);
  _bottom.store(0, std::memory_order_relaxed);
  _array.store(new Array{(int64_t{1} << LogSize)}, std::memory_order_relaxed);
  _garbage.reserve(32);
}